

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void CheckFuncAssignment(Symbol *sym,ParseNode *pnode2,ByteCodeGenerator *byteCodeGenerator)

{
  bool bVar1;
  FuncInfo *pFVar2;
  ParseNodeFnc *pPVar3;
  Scope *pSVar4;
  char16_t *reason;
  
  if (pnode2 != (ParseNode *)0x0) {
    if (pnode2->nop != knopFncDecl) {
      CheckMaybeEscapedUse(pnode2,byteCodeGenerator,false);
      return;
    }
    pFVar2 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    bVar1 = FuncInfo::IsGlobalFunction(pFVar2);
    if (!bVar1) {
      if (sym == (Symbol *)0x0) {
        reason = L"UnknownAssignment";
      }
      else {
        if (sym->scope->func == pFVar2) {
          pPVar3 = ParseNode::AsParseNodeFnc(pnode2);
          pSVar4 = pPVar3->funcInfo->bodyScope;
          do {
            pSVar4 = pSVar4->enclosingScope;
            if (sym->scope == pSVar4) {
LAB_00782457:
              bVar1 = ByteCodeGenerator::HasInterleavingDynamicScope(byteCodeGenerator,sym);
              if (bVar1) {
                pFVar2 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
                FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar2,L"InterleavingDynamicScope");
              }
              Symbol::SetHasFuncAssignment(sym,byteCodeGenerator);
              return;
            }
            if ((*(ushort *)&pSVar4->field_0x44 & 0x10) != 0) {
              FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar2,L"CrossScopeAssignment");
              goto LAB_00782457;
            }
            *(ushort *)&pSVar4->field_0x44 = *(ushort *)&pSVar4->field_0x44 | 0x20;
          } while( true );
        }
        reason = L"CrossFuncAssignment";
      }
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar2,reason);
      return;
    }
  }
  return;
}

Assistant:

void CheckFuncAssignment(Symbol * sym, ParseNode * pnode2, ByteCodeGenerator * byteCodeGenerator)
{
    if (pnode2 == nullptr)
    {
        return;
    }

    switch (pnode2->nop)
    {
    default:
        CheckMaybeEscapedUse(pnode2, byteCodeGenerator);
        break;
    case knopFncDecl:
        {
            FuncInfo * topFunc = byteCodeGenerator->TopFuncInfo();
            if (topFunc->IsGlobalFunction())
            {
                return;
            }
            // Use not as an assignment or assignment to an outer function's sym, or assigned to a formal
        // or assigned to multiple names.

            if (sym == nullptr
                || sym->GetScope()->GetFunc() != topFunc)
            {
                topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(
                sym == nullptr ? _u("UnknownAssignment") :
                (sym->GetScope()->GetFunc() != topFunc) ? _u("CrossFuncAssignment") :
                    _u("SomethingIsWrong!"))
                    );
            }
            else
            {
                // TODO-STACK-NESTED-FUNC: Since we only support single def functions, we can still put the
            // nested function on the stack and reuse even if the function goes out of the block scope.
                // However, we cannot allocate frame display or slots on the stack if the function is
            // declared in a loop, because there might be multiple functions referencing different
            // iterations of the scope.
                // For now, just disable everything.

                Scope * funcParentScope = pnode2->AsParseNodeFnc()->funcInfo->GetBodyScope()->GetEnclosingScope();
                while (sym->GetScope() != funcParentScope)
                {
                    if (funcParentScope->GetMustInstantiate())
                    {
                        topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("CrossScopeAssignment")));
                        break;
                    }
                    funcParentScope->SetHasCrossScopeFuncAssignment();
                    funcParentScope = funcParentScope->GetEnclosingScope();
                }

                // Need to always detect interleaving dynamic scope ('with') for assignments
                // as those may end up escaping into the 'with' scope.
                // TODO: the with scope is marked as MustInstantiate late during byte code emit
                // We could detect this using the loop above as well, by marking the with
                // scope as must instantiate early, this is just less risky of a fix for RTM.

                if (byteCodeGenerator->HasInterleavingDynamicScope(sym))
                {
                     byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("InterleavingDynamicScope")));
                }

                sym->SetHasFuncAssignment(byteCodeGenerator);
            }
        }
        break;
    };
}